

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O3

Bit16u MT32Emu::LA32Utilites::interpolateExp(Bit16u fract)

{
  Bit16u BVar1;
  uint uVar2;
  Tables *pTVar3;
  ushort uVar4;
  undefined2 in_register_0000003a;
  uint uVar5;
  
  uVar5 = CONCAT22(in_register_0000003a,fract) >> 3;
  pTVar3 = Tables::getInstance();
  BVar1 = pTVar3->exp9[uVar5];
  uVar2 = 0x1fff;
  if (7 < fract) {
    pTVar3 = Tables::getInstance();
    uVar2 = (uint)(ushort)(0x1fff - pTVar3->exp9[uVar5 - 1]);
  }
  uVar4 = 0x1fff - BVar1;
  return (short)((uVar2 - uVar4) * (~CONCAT22(in_register_0000003a,fract) & 7) >> 3) + uVar4;
}

Assistant:

Bit16u LA32Utilites::interpolateExp(const Bit16u fract) {
	Bit16u expTabIndex = fract >> 3;
	Bit16u extraBits = ~fract & 7;
	Bit16u expTabEntry2 = 8191 - Tables::getInstance().exp9[expTabIndex];
	Bit16u expTabEntry1 = expTabIndex == 0 ? 8191 : (8191 - Tables::getInstance().exp9[expTabIndex - 1]);
	return expTabEntry2 + (((expTabEntry1 - expTabEntry2) * extraBits) >> 3);
}